

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<false,_false,_false>::pack_bc(DaTrie<false,_false,_false> *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t node_pos;
  reference pvVar4;
  DaTrie<false,_false,_false> *in_RDI;
  DaTrie<false,_false,_false> *unaff_retaddr;
  uint32_t base;
  uint32_t i;
  uint32_t max_pos;
  uint32_t in_stack_00000038;
  uint32_t in_stack_0000003c;
  Edge edge;
  Query query;
  Query *this_00;
  undefined4 in_stack_fffffffffffffeb0;
  uint32_t in_stack_fffffffffffffec0;
  uint uVar5;
  undefined4 in_stack_fffffffffffffecc;
  Edge local_128;
  Query *in_stack_ffffffffffffffe8;
  Edge *in_stack_fffffffffffffff0;
  DaTrie<false,_false,_false> *pDVar6;
  
  pDVar6 = in_RDI;
  Query::Query((Query *)&stack0xffffffffffffffe0);
  Edge::Edge(&local_128);
  while (uVar2 = bc_emps(in_RDI), 0xff < uVar2) {
    uVar3 = bc_size((DaTrie<false,_false,_false> *)0x15fe32);
    for (uVar5 = 0; uVar5 < 0x100; uVar5 = uVar5 + 1) {
      uVar3 = uVar3 - 1;
      pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar3)
      ;
      bVar1 = Bc::is_fixed(pvVar4);
      if (bVar1) break;
    }
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar3);
    bVar1 = Bc::is_fixed(pvVar4);
    if (!bVar1) {
      __assert_fail("bc_[max_pos].is_fixed()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                    ,0xba,
                    "void ddd::DaTrie<false, false, false>::pack_bc() [WithBLM = false, WithNLM = false, Prefix = false]"
                   );
    }
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar3);
    node_pos = Bc::check(pvVar4);
    this_00 = (Query *)&stack0xffffffffffffffe0;
    Query::set_node_pos(this_00,node_pos);
    Query::node_pos(this_00);
    edge_((DaTrie<false,_false,_false> *)CONCAT44(uVar5,in_stack_fffffffffffffec0),
          (uint32_t)((ulong)in_RDI >> 0x20),(Edge *)CONCAT44(uVar2,in_stack_fffffffffffffeb0),
          (size_t)this_00);
    in_stack_fffffffffffffec0 =
         excheck_((DaTrie<false,_false,_false> *)CONCAT44(in_stack_fffffffffffffecc,uVar3),
                  (Edge *)CONCAT44(uVar5,in_stack_fffffffffffffec0),
                  (vector<ddd::Block,_std::allocator<ddd::Block>_> *)in_RDI);
    if (in_stack_fffffffffffffec0 == 0xffffffff) break;
    shelter_(unaff_retaddr,(uint32_t)((ulong)pDVar6 >> 0x20),in_stack_fffffffffffffff0,
             in_stack_ffffffffffffffe8);
    Query::node_pos((Query *)&stack0xffffffffffffffe0);
    move_((DaTrie<false,_false,_false> *)edge.labels_._0_8_,in_stack_0000003c,in_stack_00000038,
          _max_pos,_base);
  }
  Edge::~Edge(&local_128);
  Query::~Query((Query *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void pack_bc() {
    assert(!Prefix);

    Query query;
    Edge edge;

    while (BLOCK_SIZE <= bc_emps()) {
      auto max_pos = bc_size();
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        if (bc_[--max_pos].is_fixed()) {
          break;
        }
      }
      assert(bc_[max_pos].is_fixed());

      query.set_node_pos(bc_[max_pos].check());
      edge_(query.node_pos(), edge);

      auto base = excheck_(edge, blocks_);
      if (base == NOT_FOUND) {
        break;
      }

      shelter_(base, edge, query);
      move_(query.node_pos(), base, edge, query);
    }
  }